

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O1

void __thiscall
f8n::runtime::MessageQueue::Debounce(MessageQueue *this,IMessagePtr *message,int64_t delayMs)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  iVar1 = (*((message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_IMessage[2])();
  uVar2 = (*((message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_IMessage[3])();
  (*(this->super_IMessageQueue)._vptr_IMessageQueue[3])
            (this,CONCAT44(extraout_var,iVar1),(ulong)uVar2);
  local_30 = (message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  local_28 = (message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  (*(this->super_IMessageQueue)._vptr_IMessageQueue[2])(this,&local_30,delayMs);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

void MessageQueue::Debounce(IMessagePtr message, int64_t delayMs) {
    Remove(message->Target(), message->Type());
    Post(message, delayMs);
}